

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void __thiscall CodeGenGenericContext::MemRead(CodeGenGenericContext *this,x86Argument *address)

{
  x86Reg xVar1;
  uint uVar2;
  x86Reg xVar3;
  uint uVar4;
  x86Reg xVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  
  xVar1 = address->ptrIndex;
  uVar2 = address->ptrNum;
  lVar9 = 0;
  do {
    if ((*(int *)((long)&this->memCache[0].address.type + lVar9) != 0) &&
       (address->ptrBase != rR14 || xVar1 != rNONE)) {
      bVar7 = address->ptrBase != rEBX;
      bVar8 = xVar1 != rNONE;
      if (bVar7 || bVar8) {
LAB_001e245d:
        if ((*(int *)((long)&this->memCache[0].address.ptrIndex + lVar9) != 0) ||
           (*(int *)((long)&this->memCache[0].address.ptrBase + lVar9) != 2)) {
          if (!bVar7 && !bVar8) goto LAB_001e247a;
          goto LAB_001e24ee;
        }
      }
      else if ((*(int *)((long)&this->memCache[0].address.ptrIndex + lVar9) == 0) &&
              (*(int *)((long)&this->memCache[0].address.ptrBase + lVar9) == 2)) {
        if (bVar7 || bVar8) goto LAB_001e245d;
LAB_001e247a:
        if ((*(int *)((long)&this->memCache[0].address.ptrIndex + lVar9) == 0) &&
           (*(int *)((long)&this->memCache[0].address.ptrBase + lVar9) == 2)) {
          xVar3 = (address->field_1).reg;
          if (xVar3 == rNONE) {
            __assert_fail("address.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x40,"void CodeGenGenericContext::MemRead(const x86Argument &)");
          }
          uVar4 = *(uint *)((long)&this->memCache[0].address.field_1 + lVar9);
          if (uVar4 == 0) {
            __assert_fail("write.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x41,"void CodeGenGenericContext::MemRead(const x86Argument &)");
          }
          xVar5 = (uint)(xVar3 != rECX) * 4 + rEDX;
          if (xVar3 < rECX) {
            xVar5 = xVar3;
          }
          uVar6 = (uint)(uVar4 != 3) * 4 + 4;
          if (uVar4 < 3) {
            uVar6 = uVar4;
          }
          uVar4 = *(uint *)((long)&this->memCache[0].address.ptrNum + lVar9);
          if ((xVar5 + uVar2 <= uVar4) || (uVar4 + uVar6 <= uVar2)) goto LAB_001e24f6;
        }
LAB_001e24ee:
        (&this->memCache[0].read)[lVar9] = true;
      }
    }
LAB_001e24f6:
    lVar9 = lVar9 + 0x48;
    if (lVar9 == 0x480) {
      return;
    }
  } while( true );
}

Assistant:

void CodeGenGenericContext::MemRead(const x86Argument &address)
{
	(void)address;

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		x86Argument &write = entry.address;

		if(entry.address.type == x86Argument::argNone)
			continue;

		// Reading a constant can't mark any memory write entries as used, since they can't write there
		if(address.ptrIndex == rNONE && address.ptrBase == rR14)
			continue;

		// Reading from register file can't mark any memory writes with addresses from other registers since they can't point to it
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && (write.ptrIndex != rNONE || write.ptrBase != rEBX))
			continue;

		// Reading from an address in a register different from register file can't mark writes to register file as read
		if((address.ptrIndex != rNONE || address.ptrBase != rEBX) && write.ptrIndex == rNONE && write.ptrBase == rEBX)
			continue;

		// When reading and writing from register file, check read range intersection with write range
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && write.ptrIndex == rNONE && write.ptrBase == rEBX)
		{
			assert(address.ptrSize != sNONE);
			assert(write.ptrSize != sNONE);

			unsigned readSize = address.ptrSize == sBYTE ? 1 : (address.ptrSize == sWORD ? 2 : (address.ptrSize == sDWORD ? 4 : 8));
			unsigned writeSize = write.ptrSize == sBYTE ? 1 : (write.ptrSize == sWORD ? 2 : (write.ptrSize == sDWORD ? 4 : 8));

			if(unsigned(address.ptrNum) + readSize <= unsigned(write.ptrNum) || unsigned(address.ptrNum) >= unsigned(write.ptrNum) + writeSize)
				continue;
		}

		entry.read = true;
	}
}